

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).right_;
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar4 = (this->right_->fadexpr_).right_;
  return ((this->right_->fadexpr_).left_.constant_ - pFVar4->val_) *
         -(pFVar3->dx_).ptr_to_data[i] * dVar1 -
         ((pFVar2->fadexpr_).left_.constant_ - pFVar3->val_) * dVar1 * (pFVar4->dx_).ptr_to_data[i];
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}